

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.cpp
# Opt level: O0

bool Remove(Vector *V,int i)

{
  ostream *poVar1;
  int local_20;
  int j;
  int i_local;
  Vector *V_local;
  
  if (V->VectorLength == 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Vector is empty!");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    V_local._7_1_ = false;
  }
  else if ((i < 0) || (V->VectorLength + -1 < i)) {
    poVar1 = std::operator<<((ostream *)&std::cout,"position error!");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    V_local._7_1_ = false;
  }
  else {
    for (local_20 = 1; local_20 < V->VectorLength + -1; local_20 = local_20 + 1) {
      V->elements[local_20] = V->elements[local_20 + 1];
    }
    V->VectorLength = V->VectorLength + -1;
    V_local._7_1_ = true;
  }
  return V_local._7_1_;
}

Assistant:

bool Remove(Vector *V,int i)  //删除向量的第i个表目
{
    if(V->VectorLength == 0)  //空向量
    {
        cout << "Vector is empty!" << endl;
        return false;
    }
    else if(i<0||i>V->VectorLength-1)  //删除位置错误
    {
        cout << "position error!" << endl;
        return false;
    }
    else {
        int j;
        for (j = 1; j < V->VectorLength - 1; j++)  //前移
            V->elements[j] = V->elements[j+1];
        V->VectorLength--;   //向量长度减1
        return true;
    }
}